

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_get_until_first(CBS *cbs,CBS *out,uint8_t c)

{
  ulong __n;
  uint8_t *__s;
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  
  __n = cbs->len;
  iVar3 = 0;
  if (__n != 0) {
    __s = cbs->data;
    pvVar1 = memchr(__s,(uint)c,__n);
    iVar3 = 0;
    if (pvVar1 != (void *)0x0) {
      uVar2 = (long)pvVar1 - (long)__s;
      if (uVar2 <= __n) {
        cbs->data = __s + uVar2;
        cbs->len = __n - uVar2;
        out->data = __s;
        out->len = uVar2;
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int CBS_get_until_first(CBS *cbs, CBS *out, uint8_t c) {
  const uint8_t *split = reinterpret_cast<const uint8_t *>(
      OPENSSL_memchr(CBS_data(cbs), c, CBS_len(cbs)));
  if (split == NULL) {
    return 0;
  }
  return CBS_get_bytes(cbs, out, split - CBS_data(cbs));
}